

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

string * __thiscall
WorldShuffler::random_hint_for_item_abi_cxx11_
          (string *__return_storage_ptr__,WorldShuffler *this,Item *item)

{
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> local_30;
  
  RandomizerWorld::item_sources_with_item(&local_30,this->_world,item);
  if (local_30.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_30.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"in an unknown place","");
  }
  else {
    vectools::shuffle<ItemSource*>(&local_30,&this->_rng);
    random_hint_for_item_source_abi_cxx11_
              (__return_storage_ptr__,this,
               *local_30.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WorldShuffler::random_hint_for_item(Item* item)
{
    std::vector<ItemSource*> sources = _world.item_sources_with_item(item);
    if(sources.empty())
        return "in an unknown place";

    vectools::shuffle(sources, _rng);
    ItemSource* randomSource = sources[0];
    return this->random_hint_for_item_source(randomSource);
}